

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-base64X.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
YukiWorkshop::Base64X::
Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::finalize
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __finalize(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

T finalize() {
			T ret;
			__finalize(*this, ret);
			return ret;
		}